

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Verify(Psbt *this,OutPoint *outpoint)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  UtxoData *in_RSI;
  Psbt *in_RDI;
  ByteData *stack;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  ByteData scriptsig;
  TxIn txin;
  UtxoData utxo;
  uint32_t index;
  Transaction tx;
  NetType in_stack_00000e00;
  uint32_t in_stack_00000e04;
  Psbt *in_stack_00000e08;
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  *in_stack_fffffffffffff808;
  Script *in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff820;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff824;
  undefined8 in_stack_fffffffffffff828;
  CfdError error_code;
  Txid *pTVar6;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  undefined1 uVar7;
  undefined1 local_7a8 [32];
  ByteData local_788;
  reference local_768;
  ByteData *local_760;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_758;
  undefined1 *local_750;
  undefined1 local_748 [24];
  Script local_730;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_6f8;
  ByteData local_6e0;
  AbstractTxInReference local_6c8;
  TxIn local_638;
  Txid local_580;
  uint local_560;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  char *local_90;
  undefined4 local_88;
  char *local_80;
  uint32_t local_64;
  _Self local_20;
  _Self local_18;
  UtxoData *local_10;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       ::find(in_stack_fffffffffffff808,(key_type *)0x3c52b5);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       ::end(in_stack_fffffffffffff808);
  bVar1 = std::operator==(&local_18,&local_20);
  if (bVar1) {
    cfd::core::Psbt::GetTransaction();
    local_64 = GetTxInIndex(in_RDI,(OutPoint *)
                                   CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    bVar2 = cfd::core::Psbt::IsFinalizedInput((uint)in_RDI);
    uVar7 = SUB81(in_RDI,0);
    if ((bVar2 & 1) == 0) {
      local_90 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_psbt.cpp"
                         ,0x2f);
      local_90 = local_90 + 1;
      local_88 = 0x251;
      local_80 = "Verify";
      core::logger::warn<>
                ((CfdSourceLocation *)in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808);
      local_b2 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"psbt txin not finalized yet.",&local_b1);
      core::CfdException::CfdException
                ((CfdException *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                 error_code,(string *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820))
      ;
      local_b2 = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    GetUtxoData(in_stack_00000e08,in_stack_00000e04,in_stack_00000e00);
    pTVar6 = &local_580;
    cfd::core::Transaction::GetTxIn((uint)&local_6c8);
    uVar3 = core::AbstractTxInReference::GetSequence(&local_6c8);
    cfd::core::TxIn::TxIn(&local_638,pTVar6,local_560,uVar3);
    core::TxInReference::~TxInReference((TxInReference *)0x3c5520);
    cfd::core::Psbt::GetTxInFinalScript((uint)&local_6f8,(bool)uVar7);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_6f8,0)
    ;
    core::ByteData::ByteData
              ((ByteData *)in_stack_fffffffffffff810,(ByteData *)in_stack_fffffffffffff808);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               CONCAT44(uVar3,in_stack_fffffffffffff820));
    bVar2 = cfd::core::ByteData::IsEmpty();
    uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff820);
    if ((bVar2 & 1) == 0) {
      cfd::core::Script::Script(&local_730,&local_6e0);
      cfd::core::AbstractTxIn::SetUnlockingScript((Script *)&local_638);
      core::Script::~Script(in_stack_fffffffffffff810);
    }
    cfd::core::Psbt::GetTxInFinalScript((uint)local_748,(bool)uVar7);
    local_750 = local_748;
    local_758._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                   ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                    in_stack_fffffffffffff808);
    local_760 = (ByteData *)
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           in_stack_fffffffffffff808);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                               *)in_stack_fffffffffffff810,
                              (__normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                               *)in_stack_fffffffffffff808), bVar1) {
      local_768 = __gnu_cxx::
                  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                  ::operator*(&local_758);
      cfd::core::AbstractTxIn::AddScriptWitnessStack(&local_788);
      core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x3c573b);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_758);
    }
    std::
    function<cfd::core::ByteData256(cfd::core::Transaction_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*)>
    ::
    function<cfd::core::ByteData256(&)(cfd::core::Transaction_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*),void>
              ((function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
                *)CONCAT44(uVar3,uVar5),
               (_func_ByteData256_Transaction_ptr_OutPoint_ptr_UtxoData_ptr_SigHashType_ptr_Pubkey_ptr_Script_ptr_WitnessVersion_ByteData_ptr_TaprootScriptTree_ptr
                *)local_7a8);
    TransactionContextUtil::Verify<cfd::core::Transaction>
              ((Transaction *)utxo._496_8_,(OutPoint *)utxo._488_8_,(UtxoData *)utxo._480_8_,
               (AbstractTxIn *)utxo._472_8_,
               (function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
                *)utxo._464_8_);
    std::
    function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
    ::~function((function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
                 *)0x3c57b9);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               CONCAT44(uVar3,uVar5));
    core::ByteData::~ByteData((ByteData *)0x3c57d3);
    core::TxIn::~TxIn((TxIn *)0x3c57e0);
    UtxoData::~UtxoData(local_10);
    core::Transaction::~Transaction((Transaction *)local_10);
  }
  return;
}

Assistant:

void Psbt::Verify(const OutPoint& outpoint) const {
  if (verify_ignore_map_.find(outpoint) == verify_ignore_map_.end()) {
    auto tx = GetTransaction();
    uint32_t index = GetTxInIndex(outpoint);
    if (!IsFinalizedInput(index)) {
      warn(CFD_LOG_SOURCE, "psbt txin not finalized yet.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin not finalized yet.");
    }

    UtxoData utxo = GetUtxoData(index);
    TxIn txin(utxo.txid, utxo.vout, tx.GetTxIn(index).GetSequence());
    ByteData scriptsig = cfd::core::Psbt::GetTxInFinalScript(index, false)[0];
    if (!scriptsig.IsEmpty()) txin.SetUnlockingScript(Script(scriptsig));
    auto witness_stack = cfd::core::Psbt::GetTxInFinalScript(index, true);
    for (const auto& stack : witness_stack) {
      txin.AddScriptWitnessStack(stack);
    }

    TransactionContextUtil::Verify<Transaction>(
        &tx, outpoint, utxo, &txin, CollectSighashByTx);
  }
}